

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O1

int rr::anon_unknown_1::getComponentSize(VertexAttribType type)

{
  int iVar1;
  
  iVar1 = 0;
  if (type < VERTEXATTRIBTYPE_DONT_CARE) {
    iVar1 = *(int *)(&DAT_00ae9c28 + (ulong)type * 4);
  }
  return iVar1;
}

Assistant:

int getComponentSize (const VertexAttribType type)
{
	switch (type)
	{
		case VERTEXATTRIBTYPE_FLOAT:									return 4;
		case VERTEXATTRIBTYPE_HALF:										return 2;
		case VERTEXATTRIBTYPE_FIXED:									return 4;
		case VERTEXATTRIBTYPE_DOUBLE:									return (int)sizeof(double);
		case VERTEXATTRIBTYPE_NONPURE_UNORM8:							return 1;
		case VERTEXATTRIBTYPE_NONPURE_UNORM16:							return 2;
		case VERTEXATTRIBTYPE_NONPURE_UNORM32:							return 4;
		case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV:				return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM8_CLAMP:						return 1;
		case VERTEXATTRIBTYPE_NONPURE_SNORM16_CLAMP:					return 2;
		case VERTEXATTRIBTYPE_NONPURE_SNORM32_CLAMP:					return 4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP:		return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM8_SCALE:						return 1;
		case VERTEXATTRIBTYPE_NONPURE_SNORM16_SCALE:					return 2;
		case VERTEXATTRIBTYPE_NONPURE_SNORM32_SCALE:					return 4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE:		return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_UINT8:							return 1;
		case VERTEXATTRIBTYPE_NONPURE_UINT16:							return 2;
		case VERTEXATTRIBTYPE_NONPURE_UINT32:							return 4;
		case VERTEXATTRIBTYPE_NONPURE_INT8:								return 1;
		case VERTEXATTRIBTYPE_NONPURE_INT16:							return 2;
		case VERTEXATTRIBTYPE_NONPURE_INT32:							return 4;
		case VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV:				return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV:				return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_PURE_UINT8:								return 1;
		case VERTEXATTRIBTYPE_PURE_UINT16:								return 2;
		case VERTEXATTRIBTYPE_PURE_UINT32:								return 4;
		case VERTEXATTRIBTYPE_PURE_INT8:								return 1;
		case VERTEXATTRIBTYPE_PURE_INT16:								return 2;
		case VERTEXATTRIBTYPE_PURE_INT32:								return 4;
		case VERTEXATTRIBTYPE_NONPURE_UNORM8_BGRA:						return 1;
		case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA:		return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA:	return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA:	return (int)sizeof(deUint32)/4;
		default:
			DE_ASSERT(false);
			return 0;
	}
}